

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O2

void __thiscall ot::commissioner::JobManager::CancelCommand(JobManager *this)

{
  pointer ppJVar1;
  undefined4 uVar2;
  uint uVar3;
  pointer ppJVar4;
  CommissionerAppPtr commissioner;
  Error error;
  CommissionerAppPtr local_88;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  local_50._0_4_ = kNone;
  local_48._M_p = (pointer)&local_38;
  local_40 = 0;
  local_88.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_88.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._M_local_buf[0] = '\0';
  ppJVar4 = (this->mJobPool).
            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppJVar1 = (this->mJobPool).
            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppJVar4 == ppJVar1) {
      WaitForJobs(this);
      GetSelectedCommissioner((Error *)local_78,this,&local_88);
      Error::operator=((Error *)local_50,(Error *)local_78);
      std::__cxx11::string::~string((string *)&local_70);
      uVar2 = local_50._0_4_;
      local_78._0_4_ = kNone;
      local_70._M_p = (pointer)&local_60;
      local_68 = 0;
      local_60._M_local_buf[0] = '\0';
      std::__cxx11::string::~string((string *)&local_70);
      if (uVar2 == kNone) {
        uVar3 = (*((local_88.
                    super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
        (*((local_88.
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->super_CommissionerHandler)._vptr_CommissionerHandler[(ulong)(uVar3 & 0xff) + 0xd])();
      }
      std::__cxx11::string::~string((string *)&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_88.
                  super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return;
    }
    if (*ppJVar4 == (Job *)0x0) break;
    Job::Cancel(*ppJVar4);
    ppJVar4 = ppJVar4 + 1;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                ,0x284,"void ot::commissioner::JobManager::CancelCommand()");
}

Assistant:

void JobManager::CancelCommand()
{
    CommissionerAppPtr commissioner = nullptr;
    Error              error        = ERROR_NONE;

    for (auto job : mJobPool)
    {
        ASSERT(job != nullptr);
        job->Cancel();
    }
    WaitForJobs();

    error = GetSelectedCommissioner(commissioner);
    if (error == ERROR_NONE)
    {
        if (commissioner->IsActive())
        {
            commissioner->CancelRequests();
        }
        else
        {
            commissioner->Stop();
        }
    }
}